

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O2

string * __thiscall
Assimp::XFileExporter::toXFileString_abi_cxx11_
          (string *__return_storage_ptr__,XFileExporter *this,aiString *name)

{
  byte bVar1;
  pointer pcVar2;
  int i;
  long lVar3;
  string pref;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name->data,&local_51);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  for (lVar3 = 0; lVar3 < (int)__return_storage_ptr__->_M_string_length; lVar3 = lVar3 + 1) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    bVar1 = pcVar2[lVar3];
    if (((char)bVar1 < '0') ||
       ((0x39 < bVar1 && ((bVar1 < 0x41 || (0x19 < (byte)(bVar1 + 0x9f) && 0x5a < bVar1)))))) {
      pcVar2[lVar3] = '_';
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string XFileExporter::toXFileString(aiString &name)
{
    std::string pref = ""; // node name prefix to prevent unexpected start of string
    std::string str = pref + std::string(name.C_Str());
    for (int i=0; i < (int) str.length(); ++i)
    {
        if ((str[i] >= '0' && str[i] <= '9') || // 0-9
            (str[i] >= 'A' && str[i] <= 'Z') || // A-Z
            (str[i] >= 'a' && str[i] <= 'z')) // a-z
            continue;
        str[i] = '_';
    }
    return str;
}